

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O2

void learn(print *p,base_learner *param_2,example *ec)

{
  float fVar1;
  float fVar2;
  ostream *poVar3;
  
  fVar1 = (ec->l).simple.label;
  if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,fVar1);
    std::operator<<(poVar3," ");
    fVar1 = ec->weight;
    if ((fVar1 != 1.0) ||
       (((NAN(fVar1) || (fVar2 = (ec->l).simple.initial, fVar2 != 0.0)) || (NAN(fVar2))))) {
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,fVar1);
      std::operator<<(poVar3," ");
      fVar1 = (ec->l).simple.initial;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        poVar3 = (ostream *)std::ostream::operator<<(&std::cout,fVar1);
        std::operator<<(poVar3," ");
      }
    }
  }
  if ((ec->tag)._end != (ec->tag)._begin) {
    std::operator<<((ostream *)&std::cout,'\'');
    std::ostream::write((char *)&std::cout,(long)(ec->tag)._begin);
  }
  std::operator<<((ostream *)&std::cout,"| ");
  GD::foreach_feature<vw,_unsigned_long,_&print_feature>(p->all,ec,p->all);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void learn(print& p, LEARNER::base_learner&, example& ec)
{
  label_data& ld = ec.l.simple;
  if (ld.label != FLT_MAX)
  {
    cout << ld.label << " ";
    if (ec.weight != 1 || ld.initial != 0)
    {
      cout << ec.weight << " ";
      if (ld.initial != 0)
        cout << ld.initial << " ";
    }
  }
  if (ec.tag.size() > 0)
  {
    cout << '\'';
    cout.write(ec.tag.begin(), ec.tag.size());
  }
  cout << "| ";
  GD::foreach_feature<vw, uint64_t, print_feature>(*(p.all), ec, *p.all);
  cout << endl;
}